

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::PrintValue<pstore::sstring_view<char_const*>,void>
               (sstring_view<const_char_*> *container,ostream *os)

{
  size_type sVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  sVar1 = container->size_;
  if (sVar1 != 0) {
    pcVar2 = container->ptr_;
    lVar4 = 0;
    lVar3 = 0;
    do {
      if (lVar4 == 0) {
LAB_00196f80:
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
        PrintTo(pcVar2[lVar3],os);
        lVar4 = lVar4 + 1;
        bVar5 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1);
        if (lVar4 != 0x20) goto LAB_00196f80;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar4 = 0x20;
        bVar5 = true;
      }
    } while ((!bVar5) && (bVar5 = sVar1 - 1 != lVar3, lVar3 = lVar3 + 1, bVar5));
    if (lVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }